

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_cylinder_wires
               (rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
               rf_color color)

{
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float __x;
  undefined4 local_38;
  undefined4 uStack_34;
  
  uVar2 = 3;
  if (3 < sides) {
    uVar2 = sides;
  }
  _Var1 = rf_gfx_check_buffer_limit(uVar2 * 8);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = position.x;
  uStack_34 = position.y;
  rf_gfx_translatef(local_38,uStack_34,position.z);
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  for (uVar3 = 0; uVar3 < 0x168;
      uVar3 = uVar3 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / ZEXT416(uVar2),0)) {
    __x = (float)(long)uVar3 * 0.017453292;
    fVar4 = sinf(__x);
    fVar5 = cosf(__x);
    rf_gfx_vertex3f(fVar4 * radius_bottom,0.0,fVar5 * radius_bottom);
    fVar4 = (float)(long)(0x168 / (ulong)uVar2 + uVar3) * 0.017453292;
    fVar5 = sinf(fVar4);
    fVar6 = cosf(fVar4);
    rf_gfx_vertex3f(fVar5 * radius_bottom,0.0,fVar6 * radius_bottom);
    fVar5 = sinf(fVar4);
    fVar6 = cosf(fVar4);
    rf_gfx_vertex3f(fVar5 * radius_bottom,0.0,fVar6 * radius_bottom);
    fVar5 = sinf(fVar4);
    fVar6 = cosf(fVar4);
    rf_gfx_vertex3f(fVar5 * radius_top,height,fVar6 * radius_top);
    fVar5 = sinf(fVar4);
    fVar4 = cosf(fVar4);
    rf_gfx_vertex3f(fVar5 * radius_top,height,fVar4 * radius_top);
    fVar4 = sinf(__x);
    fVar5 = cosf(__x);
    rf_gfx_vertex3f(fVar4 * radius_top,height,fVar5 * radius_top);
    fVar4 = sinf(__x);
    fVar5 = cosf(__x);
    rf_gfx_vertex3f(fVar4 * radius_top,height,fVar5 * radius_top);
    fVar4 = sinf(__x);
    fVar5 = cosf(__x);
    rf_gfx_vertex3f(fVar4 * radius_bottom,0.0,fVar5 * radius_bottom);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder_wires(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*8;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}